

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stbfile * stb_openf(FILE *f)

{
  stbfile *psVar1;
  long lVar2;
  undefined **ppuVar3;
  stbfile *psVar4;
  byte bVar5;
  
  bVar5 = 0;
  psVar1 = (stbfile *)malloc(0x68);
  if (psVar1 != (stbfile *)0x0) {
    ppuVar3 = &PTR_stb__fgetbyte_001c9c18;
    psVar4 = psVar1;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      psVar4->getbyte = (_func_int_stbfile_ptr *)*ppuVar3;
      ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
      psVar4 = (stbfile *)((long)psVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    psVar1->f = f;
  }
  return psVar1;
}

Assistant:

stbfile *stb_openf(FILE *f)
{
   stbfile m = { stb__fgetbyte, stb__fgetdata,
                 stb__fputbyte, stb__fputdata,
                 stb__fsize, stb__ftell, stb__fbackpatch, stb__fclose,
                 0,0,0, };
   stbfile *z = (stbfile *) malloc(sizeof(*z));
   if (z) {
      *z = m;
      z->f = f;
   }
   return z;
}